

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O2

void mdct_backward(mdct_lookup *init,float *in,float *out)

{
  float *x;
  float *pfVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  int points;
  float *pfVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  long lVar11;
  
  points = init->n >> 1;
  lVar11 = (long)points;
  x = out + lVar11;
  lVar7 = (long)(init->n >> 2);
  pfVar10 = x + lVar7;
  pfVar5 = init->trig;
  lVar8 = lVar11 * 4 + -0x1c;
  pfVar6 = out + lVar11 + lVar7 + -1;
  pfVar3 = pfVar5 + lVar7 + 3;
  do {
    pfVar9 = (float *)((long)in + lVar8);
    pfVar6[-3] = -pfVar9[2] * *pfVar3 - pfVar3[-1] * *pfVar9;
    pfVar6[-2] = *pfVar9 * *pfVar3 - pfVar3[-1] * pfVar9[2];
    pfVar6[-1] = -pfVar9[6] * pfVar3[-2] - pfVar3[-3] * pfVar9[4];
    *pfVar6 = pfVar9[4] * pfVar3[-2] - pfVar3[-3] * pfVar9[6];
    lVar8 = lVar8 + -0x20;
    pfVar6 = pfVar6 + -4;
    pfVar3 = pfVar3 + 4;
  } while (in <= pfVar9 + -8);
  pfVar3 = in + lVar11 + -8;
  pfVar5 = pfVar5 + lVar7 + -1;
  pfVar6 = pfVar10;
  do {
    *pfVar6 = pfVar3[4] * *pfVar5 + pfVar3[6] * pfVar5[-1];
    pfVar6[1] = pfVar3[4] * pfVar5[-1] - *pfVar5 * pfVar3[6];
    pfVar6[2] = *pfVar3 * pfVar5[-2] + pfVar3[2] * pfVar5[-3];
    pfVar6[3] = *pfVar3 * pfVar5[-3] - pfVar5[-2] * pfVar3[2];
    pfVar3 = pfVar3 + -8;
    pfVar6 = pfVar6 + 4;
    pfVar5 = pfVar5 + -4;
  } while (in <= pfVar3);
  mdct_butterflies(init,x,points);
  mdct_bitreverse(init,out);
  pfVar4 = init->trig + 7;
  pfVar5 = out + lVar7;
  pfVar6 = pfVar5;
  pfVar3 = pfVar10;
  pfVar9 = out;
  do {
    pfVar1 = pfVar6 + lVar11 + -4;
    pfVar1[3] = *pfVar9 * pfVar4[lVar11 + -6] - pfVar4[lVar11 + -7] * pfVar9[1];
    pfVar5[lVar11] = -(*pfVar9 * pfVar4[lVar11 + -7] + pfVar9[1] * pfVar4[lVar11 + -6]);
    pfVar1[2] = pfVar9[2] * pfVar4[lVar11 + -4] - pfVar4[lVar11 + -5] * pfVar9[3];
    pfVar3[1] = -(pfVar9[2] * pfVar4[lVar11 + -5] + pfVar9[3] * pfVar4[lVar11 + -4]);
    pfVar1[1] = pfVar9[4] * pfVar4[lVar11 + -2] - pfVar4[lVar11 + -3] * pfVar9[5];
    pfVar3[2] = -(pfVar9[4] * pfVar4[lVar11 + -3] + pfVar9[5] * pfVar4[lVar11 + -2]);
    *pfVar1 = pfVar9[6] * pfVar4[lVar11] - pfVar4[lVar11 + -1] * pfVar9[7];
    pfVar3[3] = -(pfVar9[6] * pfVar4[lVar11 + -1] + pfVar9[7] * pfVar4[lVar11]);
    pfVar3 = pfVar3 + 4;
    pfVar9 = pfVar9 + 8;
    pfVar4 = pfVar4 + 8;
    pfVar6 = pfVar6 + -4;
    pfVar5 = pfVar5 + 4;
  } while (pfVar9 < pfVar1);
  pfVar5 = out + lVar7;
  pfVar6 = out + lVar7;
  do {
    pfVar3 = pfVar6 + -4;
    fVar2 = pfVar6[lVar11 + -1];
    pfVar6[-1] = fVar2;
    *pfVar5 = -fVar2;
    fVar2 = pfVar6[lVar11 + -2];
    pfVar6[-2] = fVar2;
    pfVar5[1] = -fVar2;
    fVar2 = pfVar6[lVar11 + -3];
    pfVar6[-3] = fVar2;
    pfVar5[2] = -fVar2;
    fVar2 = pfVar3[lVar11];
    *pfVar3 = fVar2;
    pfVar5[3] = -fVar2;
    pfVar5 = pfVar5 + 4;
    pfVar6 = pfVar3;
  } while (pfVar5 < pfVar3 + lVar11);
  pfVar5 = out + lVar11 + lVar7 + 3;
  do {
    pfVar10[-4] = *pfVar5;
    pfVar10[-3] = pfVar5[-1];
    pfVar10[-2] = pfVar5[-2];
    pfVar10[-1] = pfVar5[-3];
    pfVar10 = pfVar10 + -4;
    pfVar5 = pfVar5 + 4;
  } while (x < pfVar10);
  return;
}

Assistant:

void mdct_backward(mdct_lookup *init, DATA_TYPE *in, DATA_TYPE *out){
  int n=init->n;
  int n2=n>>1;
  int n4=n>>2;

  /* rotate */

  DATA_TYPE *iX = in+n2-7;
  DATA_TYPE *oX = out+n2+n4;
  DATA_TYPE *T  = init->trig+n4;

  do{
    oX         -= 4;
    oX[0]       = MULT_NORM(-iX[2] * T[3] - iX[0]  * T[2]);
    oX[1]       = MULT_NORM (iX[0] * T[3] - iX[2]  * T[2]);
    oX[2]       = MULT_NORM(-iX[6] * T[1] - iX[4]  * T[0]);
    oX[3]       = MULT_NORM (iX[4] * T[1] - iX[6]  * T[0]);
    iX         -= 8;
    T          += 4;
  }while(iX>=in);

  iX            = in+n2-8;
  oX            = out+n2+n4;
  T             = init->trig+n4;

  do{
    T          -= 4;
    oX[0]       =  MULT_NORM (iX[4] * T[3] + iX[6] * T[2]);
    oX[1]       =  MULT_NORM (iX[4] * T[2] - iX[6] * T[3]);
    oX[2]       =  MULT_NORM (iX[0] * T[1] + iX[2] * T[0]);
    oX[3]       =  MULT_NORM (iX[0] * T[0] - iX[2] * T[1]);
    iX         -= 8;
    oX         += 4;
  }while(iX>=in);

  mdct_butterflies(init,out+n2,n2);
  mdct_bitreverse(init,out);

  /* roatate + window */

  {
    DATA_TYPE *oX1=out+n2+n4;
    DATA_TYPE *oX2=out+n2+n4;
    DATA_TYPE *iX =out;
    T             =init->trig+n2;

    do{
      oX1-=4;

      oX1[3]  =  MULT_NORM (iX[0] * T[1] - iX[1] * T[0]);
      oX2[0]  = -MULT_NORM (iX[0] * T[0] + iX[1] * T[1]);

      oX1[2]  =  MULT_NORM (iX[2] * T[3] - iX[3] * T[2]);
      oX2[1]  = -MULT_NORM (iX[2] * T[2] + iX[3] * T[3]);

      oX1[1]  =  MULT_NORM (iX[4] * T[5] - iX[5] * T[4]);
      oX2[2]  = -MULT_NORM (iX[4] * T[4] + iX[5] * T[5]);

      oX1[0]  =  MULT_NORM (iX[6] * T[7] - iX[7] * T[6]);
      oX2[3]  = -MULT_NORM (iX[6] * T[6] + iX[7] * T[7]);

      oX2+=4;
      iX    +=   8;
      T     +=   8;
    }while(iX<oX1);

    iX=out+n2+n4;
    oX1=out+n4;
    oX2=oX1;

    do{
      oX1-=4;
      iX-=4;

      oX2[0] = -(oX1[3] = iX[3]);
      oX2[1] = -(oX1[2] = iX[2]);
      oX2[2] = -(oX1[1] = iX[1]);
      oX2[3] = -(oX1[0] = iX[0]);

      oX2+=4;
    }while(oX2<iX);

    iX=out+n2+n4;
    oX1=out+n2+n4;
    oX2=out+n2;
    do{
      oX1-=4;
      oX1[0]= iX[3];
      oX1[1]= iX[2];
      oX1[2]= iX[1];
      oX1[3]= iX[0];
      iX+=4;
    }while(oX1>oX2);
  }
}